

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.cpp
# Opt level: O0

Document * getMessage(void)

{
  bool bVar1;
  int iVar2;
  ParseErrorCode PVar3;
  ostream *poVar4;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  undefined1 local_b8 [4];
  ParseErrorCode error;
  Document json;
  ulong uStack_40;
  char c;
  size_t i;
  string buffer;
  size_t length;
  
  buffer.field_2._8_8_ = readHeaders();
  std::__cxx11::string::string((string *)&i);
  for (uStack_40 = 0; uStack_40 < (ulong)buffer.field_2._8_8_; uStack_40 = uStack_40 + 1) {
    iVar2 = getchar();
    std::__cxx11::string::operator+=((string *)&i,(char)iVar2);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)local_b8,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *)local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  bVar1 = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                           *)local_b8);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"!!!Error parsing JSON\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&i);
    std::operator<<(poVar4,"\n");
    PVar3 = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)local_b8);
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error code: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,PVar3);
    std::operator<<(poVar4,"\n");
    sendError((Id *)0x0,ParseError,"Failed to parse JSON",(Value *)0x0);
    getMessage();
  }
  else {
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(in_RDI,(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)local_b8);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)local_b8);
  std::__cxx11::string::~string((string *)&i);
  return in_RDI;
}

Assistant:

Document getMessage () {
    size_t length = readHeaders();

    string buffer;

    for (size_t i = 0; i < length; i++) {
        char c = static_cast<char>(getchar());
        buffer += c;
    }

//    std::cerr << "INCOMING\n";
//    std::cerr << buffer << "\n\n";

    Document json;
    json.Parse(buffer);

    if (json.HasParseError()) {
        std::cerr << "!!!Error parsing JSON\n";
        std::cerr << buffer << "\n";

        auto error = json.GetParseError();
        std::cerr << "Error code: " << error << "\n";

        sendError(nullptr, ResponseHandler::ErrorCode::ParseError, "Failed to parse JSON");

        return getMessage();
    }

    return json;
}